

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ident_v3.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  long *plVar4;
  const_iterator iter;
  string input;
  context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>
  skipper_ctx;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  long *local_38;
  long local_30;
  long local_28 [2];
  context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>
  local_18;
  
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,argv[1],(allocator<char> *)&local_40);
    local_48._M_current = (char *)local_38;
    plVar4 = (long *)((long)local_38 + local_30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"parsing : ",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_38,local_30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    local_18.val = (char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag> *)
                   &boost::spirit::x3::ascii::space;
    local_40._M_current = (char *)plVar4;
    bVar1 = boost::spirit::x3::
            plus<boost::spirit::x3::sequence<boost::spirit::x3::lexeme_directive<boost::spirit::x3::sequence<boost::spirit::x3::literal_string<std::__cxx11::string,boost::spirit::char_encoding::standard,boost::spirit::x3::unused_type>,boost::spirit::x3::not_predicate<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alnum_tag>>>>,boost::spirit::x3::difference<boost::spirit::x3::lexeme_directive<boost::spirit::x3::sequence<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alpha_tag>,boost::spirit::x3::kleene<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alnum_tag>>>>,boost::spirit::x3::alternative<boost::spirit::x3::lexeme_directive<boost::spirit::x3::sequence<boost::spirit::x3::literal_string<std::__cxx11::string,boost::spirit::char_encoding::standard,boost::spirit::x3::unused_type>,boost::spirit::x3::not_predicate<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alnum_tag>>>>,boost::spirit::x3::lexeme_directive<boost::spirit::x3::sequence<boost::spirit::x3::literal_string<std::__cxx11::string,boost::spirit::char_encoding::standard,boost::spirit::x3::unused_type>,boost::spirit::x3::not_predicate<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alnum_tag>>>>>>>>
            ::
            parse<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::x3::context<boost::spirit::x3::skipper_tag,boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,boost::spirit::x3::space_tag>const,boost::spirit::x3::unused_type>,boost::spirit::x3::unused_type_const,boost::spirit::x3::unused_type_const>
                      ((plus<boost::spirit::x3::sequence<boost::spirit::x3::lexeme_directive<boost::spirit::x3::sequence<boost::spirit::x3::literal_string<std::__cxx11::string,boost::spirit::char_encoding::standard,boost::spirit::x3::unused_type>,boost::spirit::x3::not_predicate<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alnum_tag>>>>,boost::spirit::x3::difference<boost::spirit::x3::lexeme_directive<boost::spirit::x3::sequence<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alpha_tag>,boost::spirit::x3::kleene<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alnum_tag>>>>,boost::spirit::x3::alternative<boost::spirit::x3::lexeme_directive<boost::spirit::x3::sequence<boost::spirit::x3::literal_string<std::__cxx11::string,boost::spirit::char_encoding::standard,boost::spirit::x3::unused_type>,boost::spirit::x3::not_predicate<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alnum_tag>>>>,boost::spirit::x3::lexeme_directive<boost::spirit::x3::sequence<boost::spirit::x3::literal_string<std::__cxx11::string,boost::spirit::char_encoding::standard,boost::spirit::x3::unused_type>,boost::spirit::x3::not_predicate<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alnum_tag>>>>>>>>
                        *)&program_abi_cxx11_,&local_48,&local_40,&local_18,
                       (unused_type *)&boost::spirit::x3::unused,
                       (unused_type *)&boost::spirit::x3::unused);
    while (((local_48._M_current != local_40._M_current &&
            (-1 < (long)(char)*(long *)local_48._M_current)) &&
           ((boost::spirit::char_encoding::ascii_char_types[(char)*(long *)local_48._M_current] &
            0x40) != 0))) {
      local_48._M_current = local_48._M_current + 1;
    }
    if ((long *)local_48._M_current == plVar4) {
      if (bVar1) {
        iVar3 = 0;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Good input\n",0xb)
        ;
      }
      else {
        iVar3 = 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Parse failed\n",0xd);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed: didn\'t parse everything\n",0x20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"stopped ",8);
      poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," characters from the end ",0x19);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"( \'",3);
      local_40._M_current._0_1_ = *local_48._M_current;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_40,1);
      iVar3 = 1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' )\n",4);
    }
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
    return iVar3;
  }
  std::operator<<((ostream *)&std::cout,"Need something to parse\n");
  exit(1);
}

Assistant:

int main(int argc, char**argv)
{
    if (argc < 2) {
        std::cout << "Need something to parse\n";
        exit(1);
    }

    std::string input(argv[1]);

    auto iter     = input.cbegin();
    auto end_iter = input.cend();

    std::cout << "parsing : " << input << "\n";
    bool r = x3::phrase_parse(iter, end_iter, program, x3::ascii::space);

    if (iter != end_iter) {
        auto distance = end_iter - iter;
        std::cout << "Failed: didn't parse everything\n";
        std::cout << "stopped " << distance << " characters from the end "
                  << "( '" << *iter << "' )\n";
        return 1;
    } else if (r) {
        std::cout << "Good input\n";
        return 0;
    } else {
        std::cout << "Parse failed\n";
        return 1;
    }
}